

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

SampledSpectrum __thiscall pbrt::Vertex::f(Vertex *this,Vertex *next,TransportMode mode)

{
  undefined1 auVar1 [16];
  Float c;
  undefined1 in_ZMM0 [64];
  undefined1 auVar5 [56];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar6 [16];
  Point3f PVar7;
  Point3f PVar8;
  Vector3<float> wiRender;
  anon_class_16_2_f9f09593 func;
  SampledSpectrum SVar9;
  Tuple3<pbrt::Vector3,_float> local_48;
  undefined1 local_38 [16];
  SampledSpectrum local_28;
  
  auVar5 = in_ZMM0._8_56_;
  PVar7 = Interaction::p(&(next->field_2).ei.super_Interaction);
  auVar2._0_8_ = PVar7.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar2._8_56_ = auVar5;
  local_38 = auVar2._0_16_;
  PVar8 = Interaction::p(&(this->field_2).ei.super_Interaction);
  auVar3._0_8_ = PVar8.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar3._8_56_ = auVar5;
  auVar1 = vsubps_avx(local_38,auVar3._0_16_);
  local_48._0_8_ = vmovlps_avx(auVar1);
  local_48.z = PVar7.super_Tuple3<pbrt::Point3,_float>.z - PVar8.super_Tuple3<pbrt::Point3,_float>.z
  ;
  auVar6._0_4_ = auVar1._0_4_ * auVar1._0_4_;
  auVar6._4_4_ = auVar1._4_4_ * auVar1._4_4_;
  auVar6._8_4_ = auVar1._8_4_ * auVar1._8_4_;
  auVar6._12_4_ = auVar1._12_4_ * auVar1._12_4_;
  auVar6 = vmovshdup_avx(auVar6);
  auVar6 = vfmadd231ss_fma(auVar6,auVar1,auVar1);
  auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)local_48.z),ZEXT416((uint)local_48.z));
  auVar5 = ZEXT856(0);
  if ((auVar6._0_4_ != 0.0) ||
     (SVar9.values.values = (array<float,_4>)(array<float,_4>)ZEXT816(0), NAN(auVar6._0_4_))) {
    wiRender = Normalize<float>((Vector3<float> *)&local_48);
    local_48.z = wiRender.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar4._0_8_ = wiRender.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar4._8_56_ = auVar5;
    local_48._0_8_ = vmovlps_avx(auVar4._0_16_);
    if (this->type == Medium) {
      func.wi = (Vector3f *)&local_48;
      func.wo = (Vector3f *)((long)&this->field_2 + 0x1c);
      c = TaggedPointer<pbrt::HGPhaseFunction>::
          Dispatch<pbrt::PhaseFunctionHandle::p(pbrt::Vector3<float>const&,pbrt::Vector3<float>const&)const::_lambda(auto:1)_1_>
                    (&(this->field_2).mi.phase.super_TaggedPointer<pbrt::HGPhaseFunction>,func);
      SampledSpectrum::SampledSpectrum(&local_28,c);
      SVar9.values.values = local_28.values.values;
    }
    else {
      if (this->type != Surface) {
        LogFatal(Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp"
                 ,0x667,"Vertex::f(): Unimplemented");
      }
      SVar9 = BSDF::f(&this->bsdf,
                      (Vector3f)*(Tuple3<pbrt::Vector3,_float> *)((long)&this->field_2 + 0x1c),
                      (Vector3f)wiRender.super_Tuple3<pbrt::Vector3,_float>,mode);
    }
  }
  return (array<float,_4>)(array<float,_4>)SVar9;
}

Assistant:

SampledSpectrum f(const Vertex &next, TransportMode mode) const {
        Vector3f wi = next.p() - p();
        if (LengthSquared(wi) == 0)
            return {};
        wi = Normalize(wi);
        switch (type) {
        case VertexType::Surface:
            return bsdf.f(si.wo, wi, mode);
        case VertexType::Medium:
            return SampledSpectrum(mi.phase.p(mi.wo, wi));
        default:
            LOG_FATAL("Vertex::f(): Unimplemented");
            return SampledSpectrum(0.f);
        }
    }